

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

bool __thiscall
duckdb::TemporaryFileManager::HasTemporaryBuffer(TemporaryFileManager *this,block_id_t block_id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  bool bVar7;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->manager_lock);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  uVar1 = (this->used_blocks)._M_h._M_bucket_count;
  uVar4 = (ulong)block_id % uVar1;
  p_Var5 = (this->used_blocks)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)block_id)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var2[1]._M_nxt == (_Hash_node_base *)block_id)) goto LAB_017f104f;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_017f104f:
  if (p_Var6 == (__node_base_ptr)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = p_Var6->_M_nxt != (_Hash_node_base *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->manager_lock);
  return bVar7;
}

Assistant:

bool TemporaryFileManager::HasTemporaryBuffer(block_id_t block_id) {
	lock_guard<mutex> lock(manager_lock);
	return used_blocks.find(block_id) != used_blocks.end();
}